

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall
ON_RTreeIterator::PushChildren(ON_RTreeIterator *this,StackElement *sp,bool bFirstChild)

{
  ON_RTreeNode *pOVar1;
  int iVar2;
  StackElement *pSVar3;
  
  pOVar1 = sp->m_node;
  this->m_sp = (StackElement *)0x0;
  while( true ) {
    pSVar3 = sp + 1;
    if (((pOVar1 == (ON_RTreeNode *)0x0) || (pOVar1->m_level < 0)) || (pOVar1->m_count < 1)) {
      return false;
    }
    if (pOVar1->m_level == 0) {
      this->m_sp = sp;
      return true;
    }
    if (pSVar3 == (StackElement *)&this->m_sp) break;
    pOVar1 = pOVar1->m_branch[sp->m_branchIndex].field_1.m_child;
    pSVar3->m_node = pOVar1;
    iVar2 = 0;
    if (!bFirstChild) {
      iVar2 = pOVar1->m_count + -1;
    }
    sp[1].m_branchIndex = iVar2;
    sp = pSVar3;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
             ,0x191,"","ON_RTreeIterator::PushFirstChild - stack overflow");
  return false;
}

Assistant:

bool ON_RTreeIterator::PushChildren(StackElement* sp, bool bFirstChild )
{ 
  StackElement* spmax = &m_stack[0] + MAX_STACK;
  const ON_RTreeNode* node = sp->m_node;
  m_sp = 0;
  // push first leaf converted by this node onto the stack
  while( 0 != node && node->m_level >= 0 && node->m_count > 0 )
  {
    if ( 0 == node->m_level )
    {
      m_sp = sp;
      return true;
    }
    node = node->m_branch[sp->m_branchIndex].m_child;
    if( ++sp == spmax )
    {
      // Either this is a GIGANTIC R-tree, or, more likely, there is
      // a bug in the code that creates the R-tree and this R-tree
      // is horribly unbalanced. If the case is valid, then we must 
      // increase MAX_STACK and ship a service release.
      ON_ERROR("ON_RTreeIterator::PushFirstChild - stack overflow");
      return false;
    }
    sp->m_node = node;
    sp->m_branchIndex = bFirstChild ? 0 : node->m_count-1; // 0 for first child
  }
  return false;
}